

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGenerators::FileDiffers(cmQtAutoGenerators *this,string *filename,string *content)

{
  bool bVar1;
  bool bVar2;
  string oldContents;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  bVar1 = ReadAll(&local_30,filename);
  bVar2 = true;
  if (bVar1) {
    bVar2 = std::operator!=(&local_30,content);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return bVar2;
}

Assistant:

bool cmQtAutoGenerators::FileDiffers(const std::string& filename,
                                     const std::string& content)
{
  bool differs = true;
  {
    std::string oldContents;
    if (ReadAll(oldContents, filename)) {
      differs = (oldContents != content);
    }
  }
  return differs;
}